

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::setLayoutQualifier
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TString *id)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  iterator __first;
  iterator __last;
  iterator __result;
  char *pcVar5;
  char *feature_1;
  char *feature;
  TBlendEquationShift be;
  TLayoutStencil TStack_54;
  bool found;
  TInterlockOrdering order;
  TLayoutStencil stencil;
  TLayoutDepth depth;
  TLayoutFormat format;
  TString *id_local;
  TPublicType *publicType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::begin(id);
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::end(id);
  __result = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::begin(id);
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,int(*)(int)noexcept>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__last._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__result._M_current,tolower);
  pcVar5 = TQualifier::getLayoutMatrixString(ElmColumnMajor);
  bVar1 = std::operator==(id,pcVar5);
  if (bVar1) {
    *(ulong *)&(publicType->qualifier).field_0x8 =
         *(ulong *)&(publicType->qualifier).field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
  }
  else {
    pcVar5 = TQualifier::getLayoutMatrixString(ElmRowMajor);
    bVar1 = std::operator==(id,pcVar5);
    if (bVar1) {
      *(ulong *)&(publicType->qualifier).field_0x8 =
           *(ulong *)&(publicType->qualifier).field_0x8 & 0x1fffffffffffffff | 0x2000000000000000;
    }
    else {
      pcVar5 = TQualifier::getLayoutPackingString(ElpPacked);
      bVar1 = std::operator==(id,pcVar5);
      if (bVar1) {
        if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
          if (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U)
              != 0) {
            return;
          }
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x28])
                    (this,loc,"packed");
        }
        (publicType->qualifier).field_0x10 = (publicType->qualifier).field_0x10 & 0xf0 | 4;
      }
      else {
        pcVar5 = TQualifier::getLayoutPackingString(ElpShared);
        bVar1 = std::operator==(id,pcVar5);
        if (bVar1) {
          if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
            if (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U)
                != 0) {
              return;
            }
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x28])
                      (this,loc,"shared");
          }
          (publicType->qualifier).field_0x10 = (publicType->qualifier).field_0x10 & 0xf0 | 1;
        }
        else {
          pcVar5 = TQualifier::getLayoutPackingString(ElpStd140);
          bVar1 = std::operator==(id,pcVar5);
          if (bVar1) {
            (publicType->qualifier).field_0x10 = (publicType->qualifier).field_0x10 & 0xf0 | 2;
          }
          else {
            pcVar5 = TQualifier::getLayoutPackingString(ElpStd430);
            bVar1 = std::operator==(id,pcVar5);
            if (bVar1) {
              TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"std430");
              TParseVersions::profileRequires
                        ((TParseVersions *)this,loc,6,0x1ae,"GL_ARB_shader_storage_buffer_object",
                         "std430");
              TParseVersions::profileRequires
                        ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"std430");
              (publicType->qualifier).field_0x10 = (publicType->qualifier).field_0x10 & 0xf0 | 3;
            }
            else {
              pcVar5 = TQualifier::getLayoutPackingString(ElpScalar);
              bVar1 = std::operator==(id,pcVar5);
              if (bVar1) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
                          (this,loc,"scalar");
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                          (this,loc,1,&E_GL_EXT_scalar_block_layout,"scalar block layout");
                (publicType->qualifier).field_0x10 = (publicType->qualifier).field_0x10 & 0xf0 | 5;
              }
              else {
                for (stencil = ElsRefUnchangedFrontAMD; (int)stencil < 0x35;
                    stencil = stencil + ElsRefUnchangedFrontAMD) {
                  pcVar5 = TQualifier::getLayoutFormatString(stencil);
                  bVar1 = std::operator==(id,pcVar5);
                  if (bVar1) {
                    if ((((6 < (int)stencil) && ((int)stencil < 0x16)) ||
                        ((0x1b < (int)stencil && ((int)stencil < 0x22)))) ||
                       ((0x27 < (int)stencil && ((int)stencil < 0x35)))) {
                      TParseVersions::requireProfile
                                ((TParseVersions *)this,loc,7,"image load-store format");
                    }
                    TParseVersions::profileRequires
                              ((TParseVersions *)this,loc,7,0x1a4,"GL_ARB_shader_image_load_store",
                               "image load store");
                    TParseVersions::profileRequires
                              ((TParseVersions *)this,loc,8,0x136,"GL_ARB_shader_image_load_store",
                               "image load store");
                    (publicType->qualifier).field_0x2c = (char)stencil;
                    return;
                  }
                }
                bVar1 = std::operator==(id,"push_constant");
                if (bVar1) {
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
                            (this,loc,"push_constant");
                  (publicType->qualifier).layoutPushConstant = true;
                }
                else {
                  bVar1 = std::operator==(id,"buffer_reference");
                  if (bVar1) {
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2a])(this,loc,"buffer_reference");
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                              (this,loc,1,&E_GL_EXT_buffer_reference,"buffer_reference");
                    (publicType->qualifier).layoutBufferReference = true;
                    TIntermediate::setUseStorageBuffer
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
                    TIntermediate::setUsePhysicalStorageBuffer
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
                  }
                  else {
                    bVar1 = std::operator==(id,"bindless_sampler");
                    if (bVar1) {
                      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5]
                      )(this,loc,1,&E_GL_ARB_bindless_texture,"bindless_sampler");
                      (publicType->qualifier).layoutBindlessSampler = true;
                      TIntermediate::setBindlessTextureMode
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 &this->currentCaller,AstRefTypeLayout);
                    }
                    else {
                      bVar1 = std::operator==(id,"bindless_image");
                      if (bVar1) {
                        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [5])(this,loc,1,&E_GL_ARB_bindless_texture,"bindless_image");
                        (publicType->qualifier).layoutBindlessImage = true;
                        TIntermediate::setBindlessImageMode
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,&this->currentCaller,AstRefTypeLayout);
                      }
                      else {
                        bVar1 = std::operator==(id,"bound_sampler");
                        if (bVar1) {
                          (*(this->super_TParseContextBase).super_TParseVersions.
                            _vptr_TParseVersions[5])
                                    (this,loc,1,&E_GL_ARB_bindless_texture,"bound_sampler");
                          (publicType->qualifier).layoutBindlessSampler = false;
                        }
                        else {
                          bVar1 = std::operator==(id,"bound_image");
                          if (bVar1) {
                            (*(this->super_TParseContextBase).super_TParseVersions.
                              _vptr_TParseVersions[5])
                                      (this,loc,1,&E_GL_ARB_bindless_texture,"bound_image");
                            (publicType->qualifier).layoutBindlessImage = false;
                          }
                          else {
                            if ((((this->super_TParseContextBase).super_TParseVersions.language ==
                                  EShLangGeometry) ||
                                ((this->super_TParseContextBase).super_TParseVersions.language ==
                                 EShLangTessEvaluation)) ||
                               ((this->super_TParseContextBase).super_TParseVersions.language ==
                                EShLangMesh)) {
                              pcVar5 = TQualifier::getGeometryString(ElgTriangles);
                              bVar1 = std::operator==(id,pcVar5);
                              if (bVar1) {
                                (publicType->shaderQualifiers).geometry = ElgTriangles;
                                return;
                              }
                              if (((this->super_TParseContextBase).super_TParseVersions.language ==
                                   EShLangGeometry) ||
                                 ((this->super_TParseContextBase).super_TParseVersions.language ==
                                  EShLangMesh)) {
                                pcVar5 = TQualifier::getGeometryString(ElgPoints);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).geometry = ElgPoints;
                                  return;
                                }
                                pcVar5 = TQualifier::getGeometryString(ElgLines);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).geometry = ElgLines;
                                  return;
                                }
                                if ((this->super_TParseContextBase).super_TParseVersions.language ==
                                    EShLangGeometry) {
                                  pcVar5 = TQualifier::getGeometryString(ElgLineStrip);
                                  bVar1 = std::operator==(id,pcVar5);
                                  if (bVar1) {
                                    (publicType->shaderQualifiers).geometry = ElgLineStrip;
                                    return;
                                  }
                                  pcVar5 = TQualifier::getGeometryString(ElgLinesAdjacency);
                                  bVar1 = std::operator==(id,pcVar5);
                                  if (bVar1) {
                                    (publicType->shaderQualifiers).geometry = ElgLinesAdjacency;
                                    return;
                                  }
                                  pcVar5 = TQualifier::getGeometryString(ElgTrianglesAdjacency);
                                  bVar1 = std::operator==(id,pcVar5);
                                  if (bVar1) {
                                    (publicType->shaderQualifiers).geometry = ElgTrianglesAdjacency;
                                    return;
                                  }
                                  pcVar5 = TQualifier::getGeometryString(ElgTriangleStrip);
                                  bVar1 = std::operator==(id,pcVar5);
                                  if (bVar1) {
                                    (publicType->shaderQualifiers).geometry = ElgTriangleStrip;
                                    return;
                                  }
                                  bVar1 = std::operator==(id,"passthrough");
                                  if (bVar1) {
                                    (*(this->super_TParseContextBase).super_TParseVersions.
                                      _vptr_TParseVersions[5])
                                              (this,loc,1,&E_SPV_NV_geometry_shader_passthrough,
                                               "geometry shader passthrough");
                                    (publicType->qualifier).layoutPassthrough = true;
                                    TIntermediate::setGeoPassthroughEXT
                                              ((this->super_TParseContextBase).super_TParseVersions.
                                               intermediate);
                                    return;
                                  }
                                }
                              }
                              else {
                                if ((this->super_TParseContextBase).super_TParseVersions.language !=
                                    EShLangTessEvaluation) {
                                  __assert_fail("language == EShLangTessEvaluation",
                                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                                                ,0x17db,
                                                "void glslang::TParseContext::setLayoutQualifier(const TSourceLoc &, TPublicType &, TString &)"
                                               );
                                }
                                pcVar5 = TQualifier::getGeometryString(ElgTriangles);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).geometry = ElgTriangles;
                                  return;
                                }
                                pcVar5 = TQualifier::getGeometryString(ElgQuads);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).geometry = ElgQuads;
                                  return;
                                }
                                pcVar5 = TQualifier::getGeometryString(ElgIsolines);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).geometry = ElgIsolines;
                                  return;
                                }
                                pcVar5 = TQualifier::getVertexSpacingString(EvsEqual);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).spacing = EvsEqual;
                                  return;
                                }
                                pcVar5 = TQualifier::getVertexSpacingString(EvsFractionalEven);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).spacing = EvsFractionalEven;
                                  return;
                                }
                                pcVar5 = TQualifier::getVertexSpacingString(EvsFractionalOdd);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).spacing = EvsFractionalOdd;
                                  return;
                                }
                                pcVar5 = TQualifier::getVertexOrderString(EvoCw);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).order = EvoCw;
                                  return;
                                }
                                pcVar5 = TQualifier::getVertexOrderString(EvoCcw);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  (publicType->shaderQualifiers).order = EvoCcw;
                                  return;
                                }
                                bVar1 = std::operator==(id,"point_mode");
                                if (bVar1) {
                                  (publicType->shaderQualifiers).pointMode = true;
                                  return;
                                }
                              }
                            }
                            if ((this->super_TParseContextBase).super_TParseVersions.language ==
                                EShLangFragment) {
                              bVar1 = std::operator==(id,"origin_upper_left");
                              if (bVar1) {
                                TParseVersions::requireProfile
                                          ((TParseVersions *)this,loc,7,"origin_upper_left");
                                if ((this->super_TParseContextBase).super_TParseVersions.profile ==
                                    ENoProfile) {
                                  TParseVersions::profileRequires
                                            ((TParseVersions *)this,loc,6,0x8c,
                                             "GL_ARB_fragment_coord_conventions","origin_upper_left"
                                            );
                                }
                                (publicType->shaderQualifiers).originUpperLeft = true;
                                return;
                              }
                              bVar1 = std::operator==(id,"pixel_center_integer");
                              if (bVar1) {
                                TParseVersions::requireProfile
                                          ((TParseVersions *)this,loc,7,"pixel_center_integer");
                                if ((this->super_TParseContextBase).super_TParseVersions.profile ==
                                    ENoProfile) {
                                  TParseVersions::profileRequires
                                            ((TParseVersions *)this,loc,6,0x8c,
                                             "GL_ARB_fragment_coord_conventions",
                                             "pixel_center_integer");
                                }
                                (publicType->shaderQualifiers).pixelCenterInteger = true;
                                return;
                              }
                              bVar1 = std::operator==(id,"early_fragment_tests");
                              if (bVar1) {
                                TParseVersions::profileRequires
                                          ((TParseVersions *)this,loc,7,0x1a4,
                                           "GL_ARB_shader_image_load_store","early_fragment_tests");
                                TParseVersions::profileRequires
                                          ((TParseVersions *)this,loc,8,0x136,(char *)0x0,
                                           "early_fragment_tests");
                                (publicType->shaderQualifiers).earlyFragmentTests = true;
                                return;
                              }
                              bVar1 = std::operator==(id,"early_and_late_fragment_tests_amd");
                              if (bVar1) {
                                TParseVersions::profileRequires
                                          ((TParseVersions *)this,loc,7,0x1a4,
                                           "GL_AMD_shader_early_and_late_fragment_tests",
                                           "early_and_late_fragment_tests_amd");
                                TParseVersions::profileRequires
                                          ((TParseVersions *)this,loc,8,0x136,(char *)0x0,
                                           "early_and_late_fragment_tests_amd");
                                (publicType->shaderQualifiers).earlyAndLateFragmentTestsAMD = true;
                                return;
                              }
                              bVar1 = std::operator==(id,"post_depth_coverage");
                              if (bVar1) {
                                (*(this->super_TParseContextBase).super_TParseVersions.
                                  _vptr_TParseVersions[5])
                                          (this,loc,2,post_depth_coverageEXTs,"post depth coverage")
                                ;
                                uVar3 = (*(this->super_TParseContextBase).super_TParseVersions.
                                          _vptr_TParseVersions[8])
                                                  (this,"GL_ARB_post_depth_coverage");
                                if ((uVar3 & 1) != 0) {
                                  (publicType->shaderQualifiers).earlyFragmentTests = true;
                                }
                                (publicType->shaderQualifiers).postDepthCoverage = true;
                                return;
                              }
                              bVar1 = std::operator==(id,"non_coherent_color_attachment_readext");
                              if (bVar1) {
                                (*(this->super_TParseContextBase).super_TParseVersions.
                                  _vptr_TParseVersions[5])
                                          (this,loc,1,&E_GL_EXT_shader_tile_image,
                                           "non_coherent_color_attachment_readEXT");
                                (publicType->shaderQualifiers).nonCoherentColorAttachmentReadEXT =
                                     true;
                                return;
                              }
                              bVar1 = std::operator==(id,"non_coherent_depth_attachment_readext");
                              if (bVar1) {
                                (*(this->super_TParseContextBase).super_TParseVersions.
                                  _vptr_TParseVersions[5])
                                          (this,loc,1,&E_GL_EXT_shader_tile_image,
                                           "non_coherent_depth_attachment_readEXT");
                                (publicType->shaderQualifiers).nonCoherentDepthAttachmentReadEXT =
                                     true;
                                return;
                              }
                              bVar1 = std::operator==(id,"non_coherent_stencil_attachment_readext");
                              if (bVar1) {
                                (*(this->super_TParseContextBase).super_TParseVersions.
                                  _vptr_TParseVersions[5])
                                          (this,loc,1,&E_GL_EXT_shader_tile_image,
                                           "non_coherent_stencil_attachment_readEXT");
                                (publicType->shaderQualifiers).nonCoherentStencilAttachmentReadEXT =
                                     true;
                                return;
                              }
                              for (order = EioPixelInterlockOrdered; (int)order < 5;
                                  order = order + EioPixelInterlockOrdered) {
                                pcVar5 = TQualifier::getLayoutDepthString(order);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  TParseVersions::requireProfile
                                            ((TParseVersions *)this,loc,6,"depth layout qualifier");
                                  TParseVersions::profileRequires
                                            ((TParseVersions *)this,loc,6,0x1a4,(char *)0x0,
                                             "depth layout qualifier");
                                  (publicType->shaderQualifiers).layoutDepth = order;
                                  return;
                                }
                              }
                              for (TStack_54 = ElsRefUnchangedFrontAMD; (int)TStack_54 < 7;
                                  TStack_54 = TStack_54 + ElsRefUnchangedFrontAMD) {
                                pcVar5 = TQualifier::getLayoutStencilString(TStack_54);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  TParseVersions::requireProfile
                                            ((TParseVersions *)this,loc,6,"stencil layout qualifier"
                                            );
                                  TParseVersions::profileRequires
                                            ((TParseVersions *)this,loc,6,0x1a4,(char *)0x0,
                                             "stencil layout qualifier");
                                  (publicType->shaderQualifiers).layoutStencil = TStack_54;
                                  return;
                                }
                              }
                              for (be = EBlendScreen; (int)be < 7; be = be + EBlendScreen) {
                                pcVar5 = TQualifier::getInterlockOrderingString(be);
                                bVar1 = std::operator==(id,pcVar5);
                                if (bVar1) {
                                  TParseVersions::requireProfile
                                            ((TParseVersions *)this,loc,6,
                                             "fragment shader interlock layout qualifier");
                                  TParseVersions::profileRequires
                                            ((TParseVersions *)this,loc,6,0x1c2,(char *)0x0,
                                             "fragment shader interlock layout qualifier");
                                  pcVar5 = TQualifier::getInterlockOrderingString(be);
                                  (*(this->super_TParseContextBase).super_TParseVersions.
                                    _vptr_TParseVersions[5])
                                            (this,loc,1,&E_GL_ARB_fragment_shader_interlock,pcVar5);
                                  if ((be == EBlendColordodge) || (be == EBlendColorburn)) {
                                    pcVar5 = TQualifier::getInterlockOrderingString(be);
                                    (*(this->super_TParseContextBase).super_TParseVersions.
                                      _vptr_TParseVersions[5])
                                              (this,loc,1,&E_GL_NV_shading_rate_image,pcVar5);
                                  }
                                  (publicType->shaderQualifiers).interlockOrdering = be;
                                  return;
                                }
                              }
                              iVar4 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(id,0,0xd,"blend_support");
                              if (iVar4 == 0) {
                                bVar1 = false;
                                feature._0_4_ = EBlendMultiply;
                                do {
                                  if (0xf < (int)(TBlendEquationShift)feature) {
LAB_0076d3e5:
                                    if (bVar1) {
                                      return;
                                    }
                                    (*(this->super_TParseContextBase).super_TParseVersions.
                                      _vptr_TParseVersions[0x2d])
                                              (this,loc,"unknown blend equation","blend_support","")
                                    ;
                                    return;
                                  }
                                  pcVar5 = TQualifier::getBlendEquationString
                                                     ((TBlendEquationShift)feature);
                                  bVar2 = std::operator==(id,pcVar5);
                                  if (bVar2) {
                                    TParseVersions::profileRequires
                                              ((TParseVersions *)this,loc,8,0x140,
                                               "GL_KHR_blend_equation_advanced","blend equation");
                                    TParseVersions::profileRequires
                                              ((TParseVersions *)this,loc,-9,0,
                                               "GL_KHR_blend_equation_advanced","blend equation");
                                    TIntermediate::addBlendEquation
                                              ((this->super_TParseContextBase).super_TParseVersions.
                                               intermediate,(TBlendEquationShift)feature);
                                    (publicType->shaderQualifiers).blendEquation = true;
                                    bVar1 = true;
                                    goto LAB_0076d3e5;
                                  }
                                  feature._0_4_ = (TBlendEquationShift)feature + EBlendScreen;
                                } while( true );
                              }
                              bVar1 = std::operator==(id,"override_coverage");
                              if (bVar1) {
                                (*(this->super_TParseContextBase).super_TParseVersions.
                                  _vptr_TParseVersions[5])
                                          (this,loc,1,&E_GL_NV_sample_mask_override_coverage,
                                           "sample mask override coverage");
                                (publicType->shaderQualifiers).layoutOverrideCoverage = true;
                                return;
                              }
                              bVar1 = std::operator==(id,"full_quads");
                              if (bVar1) {
                                TParseVersions::requireProfile
                                          ((TParseVersions *)this,loc,0xe,"full_quads qualifier");
                                TParseVersions::profileRequires
                                          ((TParseVersions *)this,loc,6,0x8c,
                                           "GL_EXT_shader_quad_control","full_quads qualifier");
                                TParseVersions::profileRequires
                                          ((TParseVersions *)this,loc,8,0x136,
                                           "GL_EXT_shader_quad_control","full_quads qualifier");
                                (publicType->qualifier).layoutFullQuads = true;
                                return;
                              }
                            }
                            if (((((this->super_TParseContextBase).super_TParseVersions.language ==
                                   EShLangVertex) ||
                                 ((this->super_TParseContextBase).super_TParseVersions.language ==
                                  EShLangTessControl)) ||
                                ((this->super_TParseContextBase).super_TParseVersions.language ==
                                 EShLangTessEvaluation)) ||
                               ((this->super_TParseContextBase).super_TParseVersions.language ==
                                EShLangGeometry)) {
                              bVar1 = std::operator==(id,"viewport_relative");
                              if (bVar1) {
                                (*(this->super_TParseContextBase).super_TParseVersions.
                                  _vptr_TParseVersions[5])
                                          (this,loc,1,&E_GL_NV_viewport_array2,"view port array2");
                                (publicType->qualifier).layoutViewportRelative = true;
                                return;
                              }
                            }
                            else if (((((this->super_TParseContextBase).super_TParseVersions.
                                        language == EShLangRayGen) ||
                                      ((this->super_TParseContextBase).super_TParseVersions.language
                                       == EShLangIntersect)) ||
                                     (((this->super_TParseContextBase).super_TParseVersions.language
                                       == EShLangAnyHit ||
                                      (((this->super_TParseContextBase).super_TParseVersions.
                                        language == EShLangClosestHit ||
                                       ((this->super_TParseContextBase).super_TParseVersions.
                                        language == EShLangMiss)))))) ||
                                    ((this->super_TParseContextBase).super_TParseVersions.language
                                     == EShLangCallable)) {
                              bVar1 = std::operator==(id,"shaderrecordnv");
                              if ((bVar1) || (bVar1 = std::operator==(id,"shaderrecordext"), bVar1))
                              {
                                bVar1 = std::operator==(id,"shaderrecordnv");
                                if (bVar1) {
                                  (*(this->super_TParseContextBase).super_TParseVersions.
                                    _vptr_TParseVersions[5])
                                            (this,loc,1,&E_GL_NV_ray_tracing,"shader record NV");
                                }
                                else {
                                  (*(this->super_TParseContextBase).super_TParseVersions.
                                    _vptr_TParseVersions[5])
                                            (this,loc,1,&E_GL_EXT_ray_tracing,"shader record EXT");
                                }
                                (publicType->qualifier).layoutShaderRecord = true;
                                return;
                              }
                              bVar1 = std::operator==(id,"hitobjectshaderrecordnv");
                              if (bVar1) {
                                (*(this->super_TParseContextBase).super_TParseVersions.
                                  _vptr_TParseVersions[5])
                                          (this,loc,1,&E_GL_NV_shader_invocation_reorder,
                                           "hitobject shader record NV");
                                (publicType->qualifier).layoutHitObjectShaderRecordNV = true;
                                return;
                              }
                            }
                            if (((this->super_TParseContextBase).super_TParseVersions.language ==
                                 EShLangCompute) &&
                               (iVar4 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        ::compare(id,0,0x11,"derivative_group_"), iVar4 == 0)) {
                              (*(this->super_TParseContextBase).super_TParseVersions.
                                _vptr_TParseVersions[5])
                                        (this,loc,1,&E_GL_NV_compute_shader_derivatives,
                                         "compute shader derivatives");
                              bVar1 = std::operator==(id,"derivative_group_quadsnv");
                              if (bVar1) {
                                (publicType->shaderQualifiers).layoutDerivativeGroupQuads = true;
                                return;
                              }
                              bVar1 = std::operator==(id,"derivative_group_linearnv");
                              if (bVar1) {
                                (publicType->shaderQualifiers).layoutDerivativeGroupLinear = true;
                                return;
                              }
                            }
                            bVar1 = std::operator==(id,"primitive_culling");
                            if (bVar1) {
                              (*(this->super_TParseContextBase).super_TParseVersions.
                                _vptr_TParseVersions[5])
                                        (this,loc,1,&E_GL_EXT_ray_flags_primitive_culling,
                                         "primitive culling");
                              (publicType->shaderQualifiers).layoutPrimitiveCulling = true;
                            }
                            else {
                              bVar1 = std::operator==(id,"quad_derivatives");
                              if (bVar1) {
                                TParseVersions::requireProfile
                                          ((TParseVersions *)this,loc,0xe,
                                           "quad_derivatives qualifier");
                                TParseVersions::profileRequires
                                          ((TParseVersions *)this,loc,6,0x8c,
                                           "GL_EXT_shader_quad_control","quad_derivatives qualifier"
                                          );
                                TParseVersions::profileRequires
                                          ((TParseVersions *)this,loc,8,0x136,
                                           "GL_EXT_shader_quad_control","quad_derivatives qualifier"
                                          );
                                (publicType->qualifier).layoutQuadDeriv = true;
                              }
                              else {
                                pcVar5 = std::__cxx11::
                                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                         ::c_str(id);
                                (*(this->super_TParseContextBase).super_TParseVersions.
                                  _vptr_TParseVersions[0x2d])
                                          (this,loc,
                                           "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)"
                                           ,pcVar5,"");
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::setLayoutQualifier(const TSourceLoc& loc, TPublicType& publicType, TString& id)
{
    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == TQualifier::getLayoutMatrixString(ElmColumnMajor)) {
        publicType.qualifier.layoutMatrix = ElmColumnMajor;
        return;
    }
    if (id == TQualifier::getLayoutMatrixString(ElmRowMajor)) {
        publicType.qualifier.layoutMatrix = ElmRowMajor;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpPacked)) {
        if (spvVersion.spv != 0) {
            if (spvVersion.vulkanRelaxed)
                return; // silently ignore qualifier
            else
                spvRemoved(loc, "packed");
        }
        publicType.qualifier.layoutPacking = ElpPacked;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpShared)) {
        if (spvVersion.spv != 0) {
            if (spvVersion.vulkanRelaxed)
                return; // silently ignore qualifier
            else
                spvRemoved(loc, "shared");
        }
        publicType.qualifier.layoutPacking = ElpShared;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpStd140)) {
        publicType.qualifier.layoutPacking = ElpStd140;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpStd430)) {
        requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, "std430");
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 430, E_GL_ARB_shader_storage_buffer_object, "std430");
        profileRequires(loc, EEsProfile, 310, nullptr, "std430");
        publicType.qualifier.layoutPacking = ElpStd430;
        return;
    }
    if (id == TQualifier::getLayoutPackingString(ElpScalar)) {
        requireVulkan(loc, "scalar");
        requireExtensions(loc, 1, &E_GL_EXT_scalar_block_layout, "scalar block layout");
        publicType.qualifier.layoutPacking = ElpScalar;
        return;
    }
    // TODO: compile-time performance: may need to stop doing linear searches
    for (TLayoutFormat format = (TLayoutFormat)(ElfNone + 1); format < ElfCount; format = (TLayoutFormat)(format + 1)) {
        if (id == TQualifier::getLayoutFormatString(format)) {
            if ((format > ElfEsFloatGuard && format < ElfFloatGuard) ||
                (format > ElfEsIntGuard && format < ElfIntGuard) ||
                (format > ElfEsUintGuard && format < ElfCount))
                requireProfile(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, "image load-store format");
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_ARB_shader_image_load_store, "image load store");
            profileRequires(loc, EEsProfile, 310, E_GL_ARB_shader_image_load_store, "image load store");
            publicType.qualifier.layoutFormat = format;
            return;
        }
    }
    if (id == "push_constant") {
        requireVulkan(loc, "push_constant");
        publicType.qualifier.layoutPushConstant = true;
        return;
    }
    if (id == "buffer_reference") {
        requireVulkan(loc, "buffer_reference");
        requireExtensions(loc, 1, &E_GL_EXT_buffer_reference, "buffer_reference");
        publicType.qualifier.layoutBufferReference = true;
        intermediate.setUseStorageBuffer();
        intermediate.setUsePhysicalStorageBuffer();
        return;
    }
    if (id == "bindless_sampler") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bindless_sampler");
        publicType.qualifier.layoutBindlessSampler = true;
        intermediate.setBindlessTextureMode(currentCaller, AstRefTypeLayout);
        return;
    }
    if (id == "bindless_image") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bindless_image");
        publicType.qualifier.layoutBindlessImage = true;
        intermediate.setBindlessImageMode(currentCaller, AstRefTypeLayout);
        return;
    }
    if (id == "bound_sampler") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bound_sampler");
        publicType.qualifier.layoutBindlessSampler = false;
        return;
    }
    if (id == "bound_image") {
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "bound_image");
        publicType.qualifier.layoutBindlessImage = false;
        return;
    }
    if (language == EShLangGeometry || language == EShLangTessEvaluation || language == EShLangMesh) {
        if (id == TQualifier::getGeometryString(ElgTriangles)) {
            publicType.shaderQualifiers.geometry = ElgTriangles;
            return;
        }
        if (language == EShLangGeometry || language == EShLangMesh) {
            if (id == TQualifier::getGeometryString(ElgPoints)) {
                publicType.shaderQualifiers.geometry = ElgPoints;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLines)) {
                publicType.shaderQualifiers.geometry = ElgLines;
                return;
            }
            if (language == EShLangGeometry) {
                if (id == TQualifier::getGeometryString(ElgLineStrip)) {
                    publicType.shaderQualifiers.geometry = ElgLineStrip;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgLinesAdjacency)) {
                    publicType.shaderQualifiers.geometry = ElgLinesAdjacency;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgTrianglesAdjacency)) {
                    publicType.shaderQualifiers.geometry = ElgTrianglesAdjacency;
                    return;
                }
                if (id == TQualifier::getGeometryString(ElgTriangleStrip)) {
                    publicType.shaderQualifiers.geometry = ElgTriangleStrip;
                    return;
                }
                if (id == "passthrough") {
                    requireExtensions(loc, 1, &E_SPV_NV_geometry_shader_passthrough, "geometry shader passthrough");
                    publicType.qualifier.layoutPassthrough = true;
                    intermediate.setGeoPassthroughEXT();
                    return;
                }
            }
        } else {
            assert(language == EShLangTessEvaluation);

            // input primitive
            if (id == TQualifier::getGeometryString(ElgTriangles)) {
                publicType.shaderQualifiers.geometry = ElgTriangles;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgQuads)) {
                publicType.shaderQualifiers.geometry = ElgQuads;
                return;
            }
            if (id == TQualifier::getGeometryString(ElgIsolines)) {
                publicType.shaderQualifiers.geometry = ElgIsolines;
                return;
            }

            // vertex spacing
            if (id == TQualifier::getVertexSpacingString(EvsEqual)) {
                publicType.shaderQualifiers.spacing = EvsEqual;
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalEven)) {
                publicType.shaderQualifiers.spacing = EvsFractionalEven;
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalOdd)) {
                publicType.shaderQualifiers.spacing = EvsFractionalOdd;
                return;
            }

            // triangle order
            if (id == TQualifier::getVertexOrderString(EvoCw)) {
                publicType.shaderQualifiers.order = EvoCw;
                return;
            }
            if (id == TQualifier::getVertexOrderString(EvoCcw)) {
                publicType.shaderQualifiers.order = EvoCcw;
                return;
            }

            // point mode
            if (id == "point_mode") {
                publicType.shaderQualifiers.pointMode = true;
                return;
            }
        }
    }
    if (language == EShLangFragment) {
        if (id == "origin_upper_left") {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile | ENoProfile, "origin_upper_left");
            if (profile == ENoProfile) {
                profileRequires(loc,ECoreProfile | ECompatibilityProfile, 140, E_GL_ARB_fragment_coord_conventions, "origin_upper_left");
            }

            publicType.shaderQualifiers.originUpperLeft = true;
            return;
        }
        if (id == "pixel_center_integer") {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile | ENoProfile, "pixel_center_integer");
            if (profile == ENoProfile) {
                profileRequires(loc,ECoreProfile | ECompatibilityProfile, 140, E_GL_ARB_fragment_coord_conventions, "pixel_center_integer");
            }
            publicType.shaderQualifiers.pixelCenterInteger = true;
            return;
        }
        if (id == "early_fragment_tests") {
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_ARB_shader_image_load_store, "early_fragment_tests");
            profileRequires(loc, EEsProfile, 310, nullptr, "early_fragment_tests");
            publicType.shaderQualifiers.earlyFragmentTests = true;
            return;
        }
        if (id == "early_and_late_fragment_tests_amd") {
            profileRequires(loc, ENoProfile | ECoreProfile | ECompatibilityProfile, 420, E_GL_AMD_shader_early_and_late_fragment_tests, "early_and_late_fragment_tests_amd");
            profileRequires(loc, EEsProfile, 310, nullptr, "early_and_late_fragment_tests_amd");
            publicType.shaderQualifiers.earlyAndLateFragmentTestsAMD = true;
            return;
        }
        if (id == "post_depth_coverage") {
            requireExtensions(loc, Num_post_depth_coverageEXTs, post_depth_coverageEXTs, "post depth coverage");
            if (extensionTurnedOn(E_GL_ARB_post_depth_coverage)) {
                publicType.shaderQualifiers.earlyFragmentTests = true;
            }
            publicType.shaderQualifiers.postDepthCoverage = true;
            return;
        }
        /* id is transformed into lower case in the beginning of this function. */
        if (id == "non_coherent_color_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_color_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentColorAttachmentReadEXT = true;
            return;
        }
        if (id == "non_coherent_depth_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_depth_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentDepthAttachmentReadEXT = true;
            return;
        }
        if (id == "non_coherent_stencil_attachment_readext") {
            requireExtensions(loc, 1, &E_GL_EXT_shader_tile_image, "non_coherent_stencil_attachment_readEXT");
            publicType.shaderQualifiers.nonCoherentStencilAttachmentReadEXT = true;
            return;
        }
        for (TLayoutDepth depth = (TLayoutDepth)(EldNone + 1); depth < EldCount; depth = (TLayoutDepth)(depth+1)) {
            if (id == TQualifier::getLayoutDepthString(depth)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "depth layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 420, nullptr, "depth layout qualifier");
                publicType.shaderQualifiers.layoutDepth = depth;
                return;
            }
        }
        for (TLayoutStencil stencil = (TLayoutStencil)(ElsNone + 1); stencil < ElsCount; stencil = (TLayoutStencil)(stencil+1)) {
            if (id == TQualifier::getLayoutStencilString(stencil)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "stencil layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 420, nullptr, "stencil layout qualifier");
                publicType.shaderQualifiers.layoutStencil = stencil;
                return;
            }
        }
        for (TInterlockOrdering order = (TInterlockOrdering)(EioNone + 1); order < EioCount; order = (TInterlockOrdering)(order+1)) {
            if (id == TQualifier::getInterlockOrderingString(order)) {
                requireProfile(loc, ECoreProfile | ECompatibilityProfile, "fragment shader interlock layout qualifier");
                profileRequires(loc, ECoreProfile | ECompatibilityProfile, 450, nullptr, "fragment shader interlock layout qualifier");
                requireExtensions(loc, 1, &E_GL_ARB_fragment_shader_interlock, TQualifier::getInterlockOrderingString(order));
                if (order == EioShadingRateInterlockOrdered || order == EioShadingRateInterlockUnordered)
                    requireExtensions(loc, 1, &E_GL_NV_shading_rate_image, TQualifier::getInterlockOrderingString(order));
                publicType.shaderQualifiers.interlockOrdering = order;
                return;
            }
        }
        if (id.compare(0, 13, "blend_support") == 0) {
            bool found = false;
            for (TBlendEquationShift be = (TBlendEquationShift)0; be < EBlendCount; be = (TBlendEquationShift)(be + 1)) {
                if (id == TQualifier::getBlendEquationString(be)) {
                    profileRequires(loc, EEsProfile, 320, E_GL_KHR_blend_equation_advanced, "blend equation");
                    profileRequires(loc, ~EEsProfile, 0, E_GL_KHR_blend_equation_advanced, "blend equation");
                    intermediate.addBlendEquation(be);
                    publicType.shaderQualifiers.blendEquation = true;
                    found = true;
                    break;
                }
            }
            if (! found)
                error(loc, "unknown blend equation", "blend_support", "");
            return;
        }
        if (id == "override_coverage") {
            requireExtensions(loc, 1, &E_GL_NV_sample_mask_override_coverage, "sample mask override coverage");
            publicType.shaderQualifiers.layoutOverrideCoverage = true;
            return;
        }
        if (id == "full_quads")
        {
            const char* feature = "full_quads qualifier";
            requireProfile(loc, ECompatibilityProfile | ECoreProfile | EEsProfile, feature);
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 140, E_GL_EXT_shader_quad_control, feature);
            profileRequires(loc, EEsProfile, 310, E_GL_EXT_shader_quad_control, feature);
            publicType.qualifier.layoutFullQuads = true;
            return;
        }
    }
    if (language == EShLangVertex ||
        language == EShLangTessControl ||
        language == EShLangTessEvaluation ||
        language == EShLangGeometry ) {
        if (id == "viewport_relative") {
            requireExtensions(loc, 1, &E_GL_NV_viewport_array2, "view port array2");
            publicType.qualifier.layoutViewportRelative = true;
            return;
        }
    } else {
        if (language == EShLangRayGen || language == EShLangIntersect ||
        language == EShLangAnyHit || language == EShLangClosestHit ||
        language == EShLangMiss || language == EShLangCallable) {
            if (id == "shaderrecordnv" || id == "shaderrecordext") {
                if (id == "shaderrecordnv") {
                    requireExtensions(loc, 1, &E_GL_NV_ray_tracing, "shader record NV");
                } else {
                    requireExtensions(loc, 1, &E_GL_EXT_ray_tracing, "shader record EXT");
                }
                publicType.qualifier.layoutShaderRecord = true;
                return;
            } else if (id == "hitobjectshaderrecordnv") {
                requireExtensions(loc, 1, &E_GL_NV_shader_invocation_reorder, "hitobject shader record NV");
                publicType.qualifier.layoutHitObjectShaderRecordNV = true;
                return;
            }

        }
    }
    if (language == EShLangCompute) {
        if (id.compare(0, 17, "derivative_group_") == 0) {
            requireExtensions(loc, 1, &E_GL_NV_compute_shader_derivatives, "compute shader derivatives");
            if (id == "derivative_group_quadsnv") {
                publicType.shaderQualifiers.layoutDerivativeGroupQuads = true;
                return;
            } else if (id == "derivative_group_linearnv") {
                publicType.shaderQualifiers.layoutDerivativeGroupLinear = true;
                return;
            }
        }
    }

    if (id == "primitive_culling") {
        requireExtensions(loc, 1, &E_GL_EXT_ray_flags_primitive_culling, "primitive culling");
        publicType.shaderQualifiers.layoutPrimitiveCulling = true;
        return;
    }

    if (id == "quad_derivatives")
    {
        const char* feature = "quad_derivatives qualifier";
        requireProfile(loc, ECompatibilityProfile | ECoreProfile | EEsProfile, feature);
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 140, E_GL_EXT_shader_quad_control, feature);
        profileRequires(loc, EEsProfile, 310, E_GL_EXT_shader_quad_control, feature);
        publicType.qualifier.layoutQuadDeriv = true;
        return;
    }

    error(loc, "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)", id.c_str(), "");
}